

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

int sptk::world::anon_unknown_5::ExtendF0
              (double *f0,int f0_length,int origin,int last_point,int shift,double **f0_candidates,
              int number_of_candidates,double allowed_range,double *extended_f0)

{
  uint uVar1;
  int i;
  void *pvVar2;
  long lVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  double *reference_f0;
  double *pdVar10;
  double dammy;
  double local_38;
  
  uVar5 = (ulong)f0 & 0xffffffff;
  reference_f0 = f0_candidates[(int)f0];
  uVar6 = f0_length - (int)f0;
  uVar1 = -uVar6;
  if (0 < (int)uVar6) {
    uVar1 = uVar6;
  }
  pvVar2 = operator_new__((ulong)uVar1 * 4 + 4);
  uVar8 = uVar5;
  for (lVar3 = 0; (ulong)uVar1 + 1 != lVar3; lVar3 = lVar3 + 1) {
    *(int *)((long)pvVar2 + lVar3 * 4) = (int)uVar8;
    uVar8 = (ulong)(uint)((int)uVar8 + origin);
  }
  iVar9 = 0;
  for (uVar8 = 0; iVar4 = (int)uVar5, uVar1 + 1 != uVar8; uVar8 = uVar8 + 1) {
    uVar7 = (long)*(int *)((long)pvVar2 + uVar8 * 4) + (long)origin;
    pdVar10 = (double *)
              SelectBestF0((double)reference_f0,
                           *(double **)(CONCAT44(in_register_0000000c,last_point) + uVar7 * 8),shift
                           ,allowed_range,&local_38);
    if ((double)pdVar10 != 0.0) {
      uVar5 = uVar7 & 0xffffffff;
    }
    if (NAN((double)pdVar10)) {
      uVar5 = uVar7 & 0xffffffff;
    }
    iVar4 = (int)uVar5;
    iVar9 = iVar9 + 1;
    if ((double)pdVar10 != 0.0) {
      iVar9 = 0;
    }
    f0_candidates[uVar7] = pdVar10;
    if (NAN((double)pdVar10)) {
      iVar9 = 0;
    }
    if (iVar9 == 4) break;
    reference_f0 = (double *)
                   ((ulong)reference_f0 & -(ulong)((double)pdVar10 == 0.0) |
                   ~-(ulong)((double)pdVar10 == 0.0) & (ulong)pdVar10);
  }
  operator_delete__(pvVar2);
  return iVar4;
}

Assistant:

static int ExtendF0(const double *f0, int f0_length, int origin,
    int last_point, int shift, const double * const *f0_candidates,
    int number_of_candidates, double allowed_range, double *extended_f0) {
  int threshold = 4;
  double tmp_f0 = extended_f0[origin];
  int shifted_origin = origin;

  int distance = MyAbsInt(last_point - origin);
  int *index_list = new int[distance + 1];
  for (int i = 0; i <= distance; ++i) index_list[i] = origin + shift * i;

  int count = 0;
  double dammy;
  for (int i = 0; i <= distance; ++i) {
    extended_f0[index_list[i] + shift] =
      SelectBestF0(tmp_f0, f0_candidates[index_list[i] + shift],
      number_of_candidates, allowed_range, &dammy);
    if (extended_f0[index_list[i] + shift] == 0.0) {
      count++;
    } else {
      tmp_f0 = extended_f0[index_list[i] + shift];
      count = 0;
      shifted_origin = index_list[i] + shift;
    }
    if (count == threshold) break;
  }

  delete[] index_list;
  return shifted_origin;
}